

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockTHUMB58HAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint8 y;
  long lVar9;
  int iVar10;
  int iVar11;
  uint8 *puVar12;
  uint8 colors [2] [3];
  uint8 local_42 [12];
  byte local_36;
  uint8 local_35;
  uint8 local_34;
  char local_33;
  char local_32;
  char local_31;
  
  puVar12 = img + 3;
  if (channelsRGB == 3) {
    puVar12 = alpha;
  }
  uVar5 = block_part1 >> 0xe;
  bVar2 = (byte)(block_part1 >> 10);
  local_36 = (byte)((block_part1 >> 0x16) << 4) | (byte)(block_part1 >> 0x16) & 0xf;
  local_35 = (char)((block_part1 >> 0x12) << 4) + ((byte)(block_part1 >> 0x12) & 0xf);
  local_34 = (char)(uVar5 << 4) + ((byte)uVar5 & 0xf);
  local_33 = bVar2 * '\x10' + (bVar2 & 0xf);
  local_32 = (char)((block_part1 >> 6) << 4) + ((byte)(block_part1 >> 6) & 0xf);
  local_31 = ((byte)(block_part1 >> 2) & 0xf) * '\x11';
  calculatePaintColors58H
            ((block_part1 >> 2 & 0xfff) <= (uVar5 & 0xfff) | (char)block_part1 * '\x02' & 6U,'\0',
             (uint8 (*) [3])&local_36,(uint8 (*) [3])local_42);
  iVar10 = starty * width + startx;
  iVar7 = channelsRGB * iVar10;
  iVar4 = 0;
  lVar3 = 0;
  do {
    lVar9 = 0;
    iVar11 = iVar10;
    iVar8 = iVar7;
    do {
      uVar5 = iVar4 + (int)lVar9;
      uVar5 = (uint)((block_part2 >> (uVar5 & 0x1f) & 1) != 0) +
              (block_part2 >> ((byte)uVar5 & 0x1f | 0x10) & 1) * 2;
      lVar1 = (ulong)uVar5 * 3;
      img[iVar8] = local_42[lVar1];
      img[(long)iVar8 + 1] = local_42[lVar1 + 1];
      iVar6 = iVar11 << (channelsRGB != 3) * '\x02';
      img[(long)iVar8 + 2] = local_42[lVar1 + 2];
      if (uVar5 == 2) {
        puVar12[iVar6] = '\0';
        (img + iVar8)[0] = '\0';
        (img + iVar8)[1] = '\0';
        img[(long)iVar8 + 2] = '\0';
      }
      else {
        puVar12[iVar6] = 0xff;
      }
      lVar9 = lVar9 + 1;
      iVar8 = iVar8 + channelsRGB * width;
      iVar11 = iVar11 + width;
    } while (lVar9 != 4);
    lVar3 = lVar3 + 1;
    iVar7 = iVar7 + channelsRGB;
    iVar10 = iVar10 + 1;
    iVar4 = iVar4 + 4;
  } while (lVar3 != 4);
  return;
}

Assistant:

void decompressBlockTHUMB58HAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	unsigned int col0, col1;
	uint8 colors[2][3];
	uint8 colorsRGB444[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 57);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 53);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 49);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 45);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 41);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 37);

  distance = 0;
	distance = (GETBITSHIGH(block_part1, 2, 33)) << 1;

	col0 = GETBITSHIGH(block_part1, 12, 57);
	col1 = GETBITSHIGH(block_part1, 12, 45);

	if(col0 >= col1)
	{
		distance |= 1;
	}

	// Extend the two colors to RGB888	
	decompressColor(R_BITS58H, G_BITS58H, B_BITS58H, colorsRGB444, colors);	
	
	calculatePaintColors58H(distance, PATTERN_H, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channelsRGB*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channelsRGB*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channelsRGB*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
			
			if(block_mask[x][y]==2)  
			{
				alpha[channelsA*(x+startx+(y+starty)*width)]=0;
				img[channelsRGB*((starty+y)*width+startx+x)+R] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+G] =0;
				img[channelsRGB*((starty+y)*width+startx+x)+B] =0;
			}
			else
				alpha[channelsA*(x+startx+(y+starty)*width)]=255;
		}
	}
}